

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  uhugeint_t right;
  uhugeint_t left;
  uhugeint_t left_00;
  bool bVar1;
  uint64_t unaff_RBX;
  idx_t iVar2;
  idx_t row_idx;
  uint64_t *puVar3;
  idx_t row_idx_00;
  uhugeint_t uVar4;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    puVar3 = &result_data->upper;
    for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
      left.upper = unaff_RBX;
      left.lower = (uint64_t)rsel;
      right.upper = (uint64_t)lsel;
      right.lower = (uint64_t)rdata;
      uVar4 = SubtractOperator::Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                        (left,right);
      ((uhugeint_t *)(puVar3 + -1))->lower = uVar4.lower;
      *puVar3 = uVar4.upper;
      puVar3 = puVar3 + 2;
    }
  }
  else {
    puVar3 = &result_data->upper;
    for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
      row_idx_00 = iVar2;
      if (lsel->sel_vector != (sel_t *)0x0) {
        row_idx_00 = (idx_t)lsel->sel_vector[iVar2];
      }
      row_idx = iVar2;
      if (rsel->sel_vector != (sel_t *)0x0) {
        row_idx = (idx_t)rsel->sel_vector[iVar2];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&lvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&rvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx), bVar1)
         ) {
        left_00.upper = unaff_RBX;
        left_00.lower = (uint64_t)rsel;
        uVar4.upper = (uint64_t)lsel;
        uVar4.lower = (uint64_t)rdata;
        uVar4 = SubtractOperator::
                Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>(left_00,uVar4);
        ((uhugeint_t *)(puVar3 + -1))->lower = uVar4.lower;
        *puVar3 = uVar4.upper;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,iVar2);
      }
      puVar3 = puVar3 + 2;
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}